

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_irom.h
# Opt level: O0

void __thiscall n_e_s::core::test::MockIRom::MockIRom(MockIRom *this)

{
  INesHeader local_28;
  MockIRom *local_10;
  MockIRom *this_local;
  
  local_28.nes[0] = '\0';
  local_28.nes[1] = '\0';
  local_28.nes[2] = '\0';
  local_28.nes[3] = '\0';
  local_28.prg_rom_size = '\0';
  local_28.chr_rom_size = '\0';
  local_28.flags_6 = '\0';
  local_28.flags_7 = '\0';
  local_28.prg_ram_size = '\0';
  local_28.flags_9 = '\0';
  local_28.flags_10 = '\0';
  local_28.zeros[0] = '\0';
  local_28.zeros[1] = '\0';
  local_28.zeros[2] = '\0';
  local_28.zeros[3] = '\0';
  local_28.zeros[4] = '\0';
  local_10 = this;
  INesHeader::INesHeader(&local_28);
  IRom::IRom(&this->super_IRom,&local_28);
  (this->super_IRom)._vptr_IRom = (_func_int **)&PTR__MockIRom_003f7560;
  testing::internal::FunctionMocker<bool_(unsigned_short)>::FunctionMocker
            (&this->gmock11_is_cpu_address_in_range_16);
  testing::internal::FunctionMocker<unsigned_char_(unsigned_short)>::FunctionMocker
            (&this->gmock11_cpu_read_byte_17);
  testing::internal::FunctionMocker<void_(unsigned_short,_unsigned_char)>::FunctionMocker
            (&this->gmock02_cpu_write_byte_21);
  testing::internal::FunctionMocker<bool_(unsigned_short)>::FunctionMocker
            (&this->gmock11_is_ppu_address_in_range_26);
  testing::internal::FunctionMocker<unsigned_char_(unsigned_short)>::FunctionMocker
            (&this->gmock11_ppu_read_byte_27);
  testing::internal::FunctionMocker<void_(unsigned_short,_unsigned_char)>::FunctionMocker
            (&this->gmock02_ppu_write_byte_31);
  return;
}

Assistant:

MockIRom() : IRom(INesHeader()) {}